

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O0

int md_is_table_underline(MD_CTX *ctx,MD_OFFSET beg,MD_OFFSET *p_end,uint *p_col_count)

{
  bool bVar1;
  uint *in_RCX;
  uint *in_RDX;
  uint in_ESI;
  long *in_RDI;
  bool bVar2;
  bool bVar3;
  int delimited;
  uint col_count;
  int found_pipe;
  MD_OFFSET off;
  uint local_34;
  uint local_2c;
  
  bVar1 = false;
  local_34 = 0;
  local_2c = in_ESI;
  if ((in_ESI < *(uint *)(in_RDI + 1)) && (*(char *)(*in_RDI + (ulong)in_ESI) == '|')) {
    bVar1 = true;
    local_2c = in_ESI + 1;
    while( true ) {
      bVar2 = false;
      if ((((local_2c < *(uint *)(in_RDI + 1)) &&
           (bVar2 = true, *(char *)(*in_RDI + (ulong)local_2c) != ' ')) &&
          (bVar2 = true, *(char *)(*in_RDI + (ulong)local_2c) != '\t')) &&
         (bVar2 = true, *(char *)(*in_RDI + (ulong)local_2c) != '\v')) {
        bVar2 = *(char *)(*in_RDI + (ulong)local_2c) == '\f';
      }
      if (!bVar2) break;
      local_2c = local_2c + 1;
    }
  }
  while( true ) {
    bVar2 = false;
    if ((local_2c < *(uint *)(in_RDI + 1)) && (*(char *)(*in_RDI + (ulong)local_2c) == ':')) {
      local_2c = local_2c + 1;
    }
    if ((*(uint *)(in_RDI + 1) <= local_2c) || (*(char *)(*in_RDI + (ulong)local_2c) != '-')) {
      return 0;
    }
    while( true ) {
      bVar3 = false;
      if (local_2c < *(uint *)(in_RDI + 1)) {
        bVar3 = *(char *)(*in_RDI + (ulong)local_2c) == '-';
      }
      if (!bVar3) break;
      local_2c = local_2c + 1;
    }
    if ((local_2c < *(uint *)(in_RDI + 1)) && (*(char *)(*in_RDI + (ulong)local_2c) == ':')) {
      local_2c = local_2c + 1;
    }
    local_34 = local_34 + 1;
    if (0x80 < local_34) break;
    while( true ) {
      bVar3 = false;
      if ((((local_2c < *(uint *)(in_RDI + 1)) &&
           (bVar3 = true, *(char *)(*in_RDI + (ulong)local_2c) != ' ')) &&
          (bVar3 = true, *(char *)(*in_RDI + (ulong)local_2c) != '\t')) &&
         (bVar3 = true, *(char *)(*in_RDI + (ulong)local_2c) != '\v')) {
        bVar3 = *(char *)(*in_RDI + (ulong)local_2c) == '\f';
      }
      if (!bVar3) break;
      local_2c = local_2c + 1;
    }
    if ((local_2c < *(uint *)(in_RDI + 1)) && (*(char *)(*in_RDI + (ulong)local_2c) == '|')) {
      bVar2 = true;
      bVar1 = true;
      do {
        local_2c = local_2c + 1;
        bVar3 = false;
        if (((local_2c < *(uint *)(in_RDI + 1)) &&
            (bVar3 = true, *(char *)(*in_RDI + (ulong)local_2c) != ' ')) &&
           ((bVar3 = true, *(char *)(*in_RDI + (ulong)local_2c) != '\t' &&
            (bVar3 = true, *(char *)(*in_RDI + (ulong)local_2c) != '\v')))) {
          bVar3 = *(char *)(*in_RDI + (ulong)local_2c) == '\f';
        }
      } while (bVar3);
    }
    if (((*(uint *)(in_RDI + 1) <= local_2c) || (*(char *)(*in_RDI + (ulong)local_2c) == '\r')) ||
       (*(char *)(*in_RDI + (ulong)local_2c) == '\n')) {
      if (!bVar1) {
        return 0;
      }
      *in_RDX = local_2c;
      *in_RCX = local_34;
      return 1;
    }
    if (!bVar2) {
      return 0;
    }
  }
  if (in_RDI[8] != 0) {
    (*(code *)in_RDI[8])("Suppressing table (column_count >128)",in_RDI[10]);
  }
  return 0;
}

Assistant:

static int
md_is_table_underline(MD_CTX* ctx, OFF beg, OFF* p_end, unsigned* p_col_count)
{
    OFF off = beg;
    int found_pipe = FALSE;
    unsigned col_count = 0;

    if(off < ctx->size  &&  CH(off) == _T('|')) {
        found_pipe = TRUE;
        off++;
        while(off < ctx->size  &&  ISWHITESPACE(off))
            off++;
    }

    while(1) {
        int delimited = FALSE;

        /* Cell underline ("-----", ":----", "----:" or ":----:") */
        if(off < ctx->size  &&  CH(off) == _T(':'))
            off++;
        if(off >= ctx->size  ||  CH(off) != _T('-'))
            return FALSE;
        while(off < ctx->size  &&  CH(off) == _T('-'))
            off++;
        if(off < ctx->size  &&  CH(off) == _T(':'))
            off++;

        col_count++;
        if(col_count > TABLE_MAXCOLCOUNT) {
            MD_LOG("Suppressing table (column_count >" STRINGIZE(TABLE_MAXCOLCOUNT) ")");
            return FALSE;
        }

        /* Pipe delimiter (optional at the end of line). */
        while(off < ctx->size  &&  ISWHITESPACE(off))
            off++;
        if(off < ctx->size  &&  CH(off) == _T('|')) {
            delimited = TRUE;
            found_pipe =  TRUE;
            off++;
            while(off < ctx->size  &&  ISWHITESPACE(off))
                off++;
        }

        /* Success, if we reach end of line. */
        if(off >= ctx->size  ||  ISNEWLINE(off))
            break;

        if(!delimited)
            return FALSE;
    }

    if(!found_pipe)
        return FALSE;

    *p_end = off;
    *p_col_count = col_count;
    return TRUE;
}